

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,ProcessorInstance *i)

{
  Expression *pEVar1;
  ProcessorInstance *i_local;
  ASTVisitor *this_local;
  
  pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&i->targetProcessor);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&i->specialisationArgs);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&i->clockMultiplierRatio);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&i->clockDividerRatio);
  return;
}

Assistant:

virtual void visit (AST::ProcessorInstance& i)
    {
        visitObject (*i.targetProcessor);
        visitObjectIfNotNull (i.specialisationArgs);
        visitObjectIfNotNull (i.clockMultiplierRatio);
        visitObjectIfNotNull (i.clockDividerRatio);
    }